

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRegistry.h
# Opt level: O3

bool __thiscall
anurbs::TypeEntry<anurbs::BrepLoop,_anurbs::Model>::load
          (TypeEntry<anurbs::BrepLoop,_anurbs::Model> *this,Model *model,Json *source)

{
  Attributes *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer *__ptr;
  __node_base this_02;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  Pointer<anurbs::BrepLoop> data;
  string key;
  undefined1 local_88 [24];
  pointer local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  pointer local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  pointer local_50;
  __node_base local_48;
  string local_40;
  
  key_from_json(&local_40,source);
  BrepLoop::load((BrepLoop *)local_88,model,source);
  std::__shared_ptr<anurbs::BrepLoop,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<anurbs::BrepLoop,std::default_delete<anurbs::BrepLoop>,void>
            ((__shared_ptr<anurbs::BrepLoop,(__gnu_cxx::_Lock_policy)2> *)&local_70,
             (unique_ptr<anurbs::BrepLoop,_std::default_delete<anurbs::BrepLoop>_> *)local_88);
  if ((element_type *)local_88._0_8_ != (element_type *)0x0) {
    std::default_delete<anurbs::BrepLoop>::operator()
              ((default_delete<anurbs::BrepLoop> *)local_88,(BrepLoop *)local_88._0_8_);
  }
  if (local_40._M_string_length == 0) {
    local_50 = local_70;
    local_48._M_nxt = (_Hash_node_base *)local_68;
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_68->_M_use_count = local_68->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_68->_M_use_count = local_68->_M_use_count + 1;
      }
    }
    Model::add<anurbs::BrepLoop>((Model *)local_88,(Pointer<anurbs::BrepLoop> *)model);
    this_02._M_nxt = local_48._M_nxt;
    peVar1 = (element_type *)local_88._0_8_;
    this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
  }
  else {
    local_60 = local_70;
    local_58 = local_68;
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_68->_M_use_count = local_68->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_68->_M_use_count = local_68->_M_use_count + 1;
      }
    }
    Model::add<anurbs::BrepLoop>
              ((Model *)local_88,(string *)model,(Pointer<anurbs::BrepLoop> *)&local_40);
    this_02._M_nxt = (_Hash_node_base *)local_58;
    peVar1 = (element_type *)local_88._0_8_;
    this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
  }
  local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88._0_8_ = (element_type *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02._M_nxt !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02._M_nxt);
  }
  this_00 = (peVar1->m_attributes).
            super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (peVar1->m_attributes).
            super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  Attributes::
  load<anurbs::Model,nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            (this_00,model,source);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool load(TModel& model, const Json& source) override
    {
        const auto key = key_from_json(source);

        Pointer<TData> data = TData::load(model, source);

        Ref<TData> ref;

        if (key.empty()) {
            ref = model.template add<TData>(data);
        } else {
            ref = model.template add<TData>(key, data);
        }

        ref.attributes()->load(model, source);

        return true;
    }